

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfdata.cpp
# Opt level: O0

long __thiscall PFData::getSubgridOffsetElements(PFData *this,int gridZ,int gridY,int gridX)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  long lVar6;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  PFData *in_RDI;
  long elements;
  long currBlockSizeY;
  long currBlockSizeZ;
  undefined8 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int local_3c;
  int local_38;
  int local_34;
  long local_30;
  long local_28;
  long local_20;
  int local_14;
  int local_10;
  int local_c [3];
  
  iVar4 = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c[0] = in_ESI;
  iVar1 = getSubgridSizeZ((PFData *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                          iVar4);
  local_20 = (long)iVar1;
  iVar1 = getSubgridSizeY((PFData *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                          iVar4);
  local_28 = (long)iVar1;
  iVar1 = in_RDI->m_nx;
  iVar4 = in_RDI->m_ny;
  iVar2 = getNormalBlockSizeZ(in_RDI);
  local_34 = getNormalBlockStartGridZ(in_RDI);
  piVar5 = std::min<int>(local_c,&local_34);
  iVar3 = local_c[0];
  local_30 = (long)(iVar1 * iVar4 * (iVar2 + 1) * *piVar5);
  iVar1 = getNormalBlockStartGridZ(in_RDI);
  if (iVar1 <= iVar3) {
    iVar1 = in_RDI->m_nx;
    iVar4 = in_RDI->m_ny;
    iVar3 = getNormalBlockSizeZ(in_RDI);
    iVar2 = getNormalBlockStartGridZ(in_RDI);
    local_30 = iVar1 * iVar4 * iVar3 * (local_c[0] - iVar2) + local_30;
  }
  iVar1 = in_RDI->m_nx;
  iVar4 = getNormalBlockSizeY(in_RDI);
  lVar6 = (iVar1 * (iVar4 + 1)) * local_20;
  local_38 = getNormalBlockStartGridY(in_RDI);
  piVar5 = std::min<int>(&local_10,&local_38);
  iVar1 = local_10;
  local_30 = lVar6 * *piVar5 + local_30;
  iVar4 = getNormalBlockStartGridY(in_RDI);
  if (iVar4 <= iVar1) {
    iVar1 = in_RDI->m_nx;
    iVar4 = getNormalBlockSizeY(in_RDI);
    lVar6 = (iVar1 * iVar4) * local_20;
    iVar1 = getNormalBlockStartGridY(in_RDI);
    local_30 = lVar6 * (local_10 - iVar1) + local_30;
  }
  iVar1 = getNormalBlockSizeX(in_RDI);
  lVar6 = (iVar1 + 1) * local_28 * local_20;
  local_3c = getNormalBlockStartGridX(in_RDI);
  piVar5 = std::min<int>(&local_14,&local_3c);
  local_30 = lVar6 * *piVar5 + local_30;
  iVar1 = local_14;
  iVar4 = getNormalBlockStartGridX(in_RDI);
  if (iVar4 <= iVar1) {
    iVar1 = getNormalBlockSizeX(in_RDI);
    lVar6 = iVar1 * local_28 * local_20;
    iVar1 = getNormalBlockStartGridX(in_RDI);
    local_30 = lVar6 * (local_14 - iVar1) + local_30;
  }
  return local_30;
}

Assistant:

long PFData::getSubgridOffsetElements(int gridZ, int gridY, int gridX) const{
    //NOTE: recall that remainder blocks come first, followed by normal blocks.
    //Grid dimensions of targeted block
    const long currBlockSizeZ = getSubgridSizeZ(gridZ);   //Size of the targeted Z block
    const long currBlockSizeY = getSubgridSizeY(gridY);   //Size of the targeted Y block;

    //--Calculate Z
    //Remainder blocks
    long elements = (m_nx * m_ny * (getNormalBlockSizeZ()+1))* std::min(gridZ, getNormalBlockStartGridZ());

    //Normal blocks
    if(gridZ >= getNormalBlockStartGridZ()){
        elements += (m_nx * m_ny * getNormalBlockSizeZ()) * (gridZ - getNormalBlockStartGridZ());
    }

    //--Calculate Y
    //Remainder blocks
    elements += (m_nx * (getNormalBlockSizeY()+1) * currBlockSizeZ) * std::min(gridY, getNormalBlockStartGridY());

    //Normal blocks
    if(gridY >= getNormalBlockStartGridY()){
        elements += (m_nx * getNormalBlockSizeY() * currBlockSizeZ) * (gridY - getNormalBlockStartGridY());
    }

    //--Calculate X
    //Remainder blocks
    elements += ((getNormalBlockSizeX()+1) * currBlockSizeY * currBlockSizeZ) * std::min(gridX, getNormalBlockStartGridX());

    //Normal blocks
    if(gridX >= getNormalBlockStartGridX()){
        elements += (getNormalBlockSizeX() * currBlockSizeY * currBlockSizeZ) * (gridX - getNormalBlockStartGridX());
    }

    return elements;
}